

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathCacheNewNodeSet(xmlXPathParserContextPtr pctxt,xmlNodePtr val)

{
  long *plVar1;
  int iVar2;
  xmlNodeSetPtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  
  if ((pctxt->context != (xmlXPathContextPtr)0x0) &&
     (plVar1 = (long *)pctxt->context->cache, plVar1 != (long *)0x0)) {
    pxVar4 = (xmlXPathObjectPtr)*plVar1;
    if (pxVar4 != (xmlXPathObjectPtr)0x0) {
      *plVar1 = (long)pxVar4->stringval;
      *(int *)(plVar1 + 2) = (int)plVar1[2] + -1;
      pxVar4->stringval = (xmlChar *)0x0;
      pxVar4->type = XPATH_NODESET;
      pxVar4->boolval = 0;
      if (val == (xmlNodePtr)0x0) {
        return pxVar4;
      }
      pxVar3 = pxVar4->nodesetval;
      if ((pxVar3->nodeMax != 0) && (val->type != XML_NAMESPACE_DECL)) {
        *pxVar3->nodeTab = val;
        pxVar4->nodesetval->nodeNr = 1;
        return pxVar4;
      }
      iVar2 = xmlXPathNodeSetAddUnique(pxVar3,val);
      if (-1 < iVar2) {
        return pxVar4;
      }
      xmlXPathPErrMemory(pctxt);
      return pxVar4;
    }
    if (plVar1[1] != 0) {
      pxVar3 = xmlXPathNodeSetCreate(val);
      if (pxVar3 != (xmlNodeSetPtr)0x0) {
        pxVar4 = (xmlXPathObjectPtr)plVar1[1];
        plVar1[1] = (long)pxVar4->stringval;
        *(int *)(plVar1 + 3) = (int)plVar1[3] + -1;
        pxVar4->stringval = (xmlChar *)0x0;
        pxVar4->type = XPATH_NODESET;
        pxVar4->boolval = 0;
        pxVar4->nodesetval = pxVar3;
        return pxVar4;
      }
      goto LAB_001b2e5c;
    }
  }
  pxVar4 = xmlXPathNewNodeSet(val);
  if (pxVar4 != (xmlXPathObjectPtr)0x0) {
    return pxVar4;
  }
LAB_001b2e5c:
  xmlXPathPErrMemory(pctxt);
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewNodeSet(xmlXPathParserContextPtr pctxt, xmlNodePtr val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->nodesetObjs != NULL) {
	    /*
	    * Use the nodeset-cache.
	    */
	    ret = cache->nodesetObjs;
            cache->nodesetObjs = (void *) ret->stringval;
            cache->numNodeset -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->boolval = 0;
	    if (val) {
		if ((ret->nodesetval->nodeMax == 0) ||
		    (val->type == XML_NAMESPACE_DECL))
		{
		    if (xmlXPathNodeSetAddUnique(ret->nodesetval, val) < 0)
                        xmlXPathPErrMemory(pctxt);
		} else {
		    ret->nodesetval->nodeTab[0] = val;
		    ret->nodesetval->nodeNr = 1;
		}
	    }
	    return(ret);
	} else if (cache->miscObjs != NULL) {
            xmlNodeSetPtr set;
	    /*
	    * Fallback to misc-cache.
	    */

	    set = xmlXPathNodeSetCreate(val);
	    if (set == NULL) {
                xmlXPathPErrMemory(pctxt);
		return(NULL);
	    }

	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->boolval = 0;
	    ret->nodesetval = set;
	    return(ret);
	}
    }
    ret = xmlXPathNewNodeSet(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}